

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O2

Remotes * Omega_h::unmap_owners
                    (Remotes *__return_storage_ptr__,Mesh *old_mesh,Int ent_dim,
                    LOs *new_ents2old_ents,LOs *old_ents2new_ents)

{
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> new_own_ranks;
  Write<int> new_ents2new_owners;
  Write<int> local_208;
  Write<int> local_1f8;
  Write<int> local_1e8;
  Write<int> local_1d8;
  Write<int> local_1c8;
  Write<int> local_1b8;
  Read<int> old_own_ranks;
  Write<int> local_198;
  Write<int> local_188;
  Write<int> local_178;
  Read<int> old_copies2new_owners;
  Dist old_owners2old_copies;
  Dist old_copies2old_owners;
  
  std::__cxx11::string::string
            ((string *)&new_own_ranks,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_unmap_mesh.cpp"
             ,(allocator *)&new_ents2new_owners);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_owners2old_copies,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_own_ranks
                 ,":");
  std::__cxx11::to_string((string *)&old_copies2new_owners,0x32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_copies2old_owners,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_owners2old_copies,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_copies2new_owners);
  begin_code("unmap_owners",
             (char *)old_copies2old_owners.parent_comm_.
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&old_copies2old_owners);
  std::__cxx11::string::~string((string *)&old_copies2new_owners);
  std::__cxx11::string::~string((string *)&old_owners2old_copies);
  std::__cxx11::string::~string((string *)&new_own_ranks);
  Mesh::ask_dist(&old_copies2old_owners,old_mesh,ent_dim);
  Dist::invert(&old_owners2old_copies,&old_copies2old_owners);
  Write<int>::Write(&local_178,&old_ents2new_ents->write_);
  Dist::exch<int>((Dist *)&old_copies2new_owners,(Read<int> *)&old_owners2old_copies,(Int)&local_178
                 );
  Write<int>::~Write(&local_178);
  Write<int>::Write(&local_188,&new_ents2old_ents->write_);
  Write<int>::Write(&local_198,&old_copies2new_owners.write_);
  unmap<int>((Omega_h *)&new_ents2new_owners,(LOs *)&local_188,(Read<int> *)&local_198,1);
  Write<int>::~Write(&local_198);
  Write<int>::~Write(&local_188);
  Mesh::ask_owners((Remotes *)&new_own_ranks,old_mesh,ent_dim);
  Write<int>::Write(&old_own_ranks.write_,&new_own_ranks);
  Remotes::~Remotes((Remotes *)&new_own_ranks);
  Write<int>::Write(&local_1b8,&new_ents2old_ents->write_);
  Write<int>::Write(&local_1c8,&old_own_ranks.write_);
  unmap<int>((Omega_h *)&new_own_ranks,(LOs *)&local_1b8,(Read<int> *)&local_1c8,1);
  Write<int>::~Write(&local_1c8);
  Write<int>::~Write(&local_1b8);
  Write<int>::Write(&local_1e8,&new_own_ranks);
  Read<int>::Read((Read<signed_char> *)&local_1d8,&local_1e8);
  Write<int>::Write(&local_208,&new_ents2new_owners);
  Read<int>::Read((Read<signed_char> *)&local_1f8,&local_208);
  Remotes::Remotes(__return_storage_ptr__,(Read<int> *)&local_1d8,(LOs *)&local_1f8);
  Write<int>::~Write(&local_1f8);
  Write<int>::~Write(&local_208);
  Write<int>::~Write(&local_1d8);
  Write<int>::~Write(&local_1e8);
  Write<int>::~Write(&new_own_ranks);
  Write<int>::~Write(&old_own_ranks.write_);
  Write<int>::~Write(&new_ents2new_owners);
  Write<int>::~Write(&old_copies2new_owners.write_);
  Dist::~Dist(&old_owners2old_copies);
  Dist::~Dist(&old_copies2old_owners);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Remotes unmap_owners(
    Mesh* old_mesh, Int ent_dim, LOs new_ents2old_ents, LOs old_ents2new_ents) {
  OMEGA_H_TIME_FUNCTION;
  auto old_copies2old_owners = old_mesh->ask_dist(ent_dim);
  auto old_owners2old_copies = old_copies2old_owners.invert();
  auto old_copies2new_owners = old_owners2old_copies.exch(old_ents2new_ents, 1);
  auto new_ents2new_owners = unmap(new_ents2old_ents, old_copies2new_owners, 1);
  auto old_own_ranks = old_mesh->ask_owners(ent_dim).ranks;
  auto new_own_ranks = unmap(new_ents2old_ents, old_own_ranks, 1);
  return Remotes(new_own_ranks, new_ents2new_owners);
}